

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

bool __thiscall
duckdb::CatalogSet::StartChain
          (CatalogSet *this,CatalogTransaction transaction,string *name,
          unique_lock<std::mutex> *read_lock)

{
  optional_ptr<duckdb::CatalogEntry,_true> oVar1;
  pointer pIVar2;
  CatalogType local_31;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_30;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_28;
  
  oVar1 = CreateDefaultEntry(this,transaction,name,read_lock);
  if (oVar1.ptr == (CatalogEntry *)0x0) {
    local_31 = INVALID;
    make_uniq<duckdb::InCatalogEntry,duckdb::CatalogType,duckdb::DuckCatalog&,std::__cxx11::string_const&>
              ((duckdb *)&local_30,&local_31,this->catalog,name);
    pIVar2 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_30);
    LOCK();
    (pIVar2->super_CatalogEntry).timestamp.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    pIVar2 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_30);
    (pIVar2->super_CatalogEntry).deleted = true;
    pIVar2 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_30);
    local_28._M_head_impl = local_30._M_head_impl;
    (pIVar2->super_CatalogEntry).set.ptr = this;
    local_30._M_head_impl = (InCatalogEntry *)0x0;
    CatalogEntryMap::AddEntry
              (&this->map,
               (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               &local_28);
    if (local_28._M_head_impl != (InCatalogEntry *)0x0) {
      (*((local_28._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    }
    local_28._M_head_impl = (InCatalogEntry *)0x0;
    if (local_30._M_head_impl != (InCatalogEntry *)0x0) {
      (*((local_30._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    }
  }
  return oVar1.ptr == (CatalogEntry *)0x0;
}

Assistant:

bool CatalogSet::StartChain(CatalogTransaction transaction, const string &name, unique_lock<mutex> &read_lock) {
	D_ASSERT(!map.GetEntry(name));

	// check if there is a default entry
	auto entry = CreateDefaultEntry(transaction, name, read_lock);
	if (entry) {
		return false;
	}

	// first create a dummy deleted entry
	// so other transactions will see that instead of the entry that is to be added.
	auto dummy_node = make_uniq<InCatalogEntry>(CatalogType::INVALID, catalog, name);
	dummy_node->timestamp = 0;
	dummy_node->deleted = true;
	dummy_node->set = this;

	map.AddEntry(std::move(dummy_node));
	return true;
}